

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O2

int run_test_pipe_set_non_blocking(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uStack_1180;
  int fd [2];
  uv_thread_t thread;
  thread_ctx ctx;
  uv_buf_t buf;
  uv_pipe_t pipe_handle;
  char data [4096];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
  if (iVar1 == 0) {
    iVar1 = socketpair(1,1,0,fd);
    if (iVar1 == 0) {
      iVar1 = uv_pipe_open(&pipe_handle,fd[0]);
      if (iVar1 == 0) {
        iVar1 = uv_stream_set_blocking(&pipe_handle,1);
        if (iVar1 == 0) {
          ctx.fd = fd[1];
          iVar1 = uv_barrier_init(&ctx,2);
          if (iVar1 == 0) {
            iVar1 = uv_thread_create(&thread,thread_main,&ctx);
            if (iVar1 == 0) {
              uv_barrier_wait(&ctx);
              buf.len = 0x1000;
              buf.base = data;
              memset(buf.base,0x2e,0x1000);
              uVar4 = 0xfffffffffffff000;
              do {
                uVar4 = uVar4 + 0x1000;
                if (0x9fffff < uVar4) {
                  uv_close(&pipe_handle,0);
                  uVar2 = uv_default_loop();
                  iVar1 = uv_run(uVar2,0);
                  if (iVar1 == 0) {
                    iVar1 = uv_thread_join(&thread);
                    if (iVar1 == 0) {
                      iVar1 = close(fd[1]);
                      if (iVar1 == 0) {
                        uv_barrier_destroy(&ctx);
                        uVar2 = uv_default_loop();
                        uv_walk(uVar2,close_walk_cb,0);
                        uv_run(uVar2,0);
                        uVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_1180 = 0x5f;
                      }
                      else {
                        pcVar3 = "0 == close(fd[1])";
                        uStack_1180 = 0x5c;
                      }
                    }
                    else {
                      pcVar3 = "0 == uv_thread_join(&thread)";
                      uStack_1180 = 0x5b;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                    uStack_1180 = 0x59;
                  }
                  goto LAB_00141fef;
                }
                iVar1 = uv_try_write(&pipe_handle,&buf,1);
              } while (iVar1 == 0x1000);
              pcVar3 = "n == sizeof(data)";
              uStack_1180 = 0x54;
            }
            else {
              pcVar3 = "0 == uv_thread_create(&thread, thread_main, &ctx)";
              uStack_1180 = 0x47;
            }
          }
          else {
            pcVar3 = "0 == uv_barrier_init(&ctx.barrier, 2)";
            uStack_1180 = 0x46;
          }
        }
        else {
          pcVar3 = "0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1)";
          uStack_1180 = 0x43;
        }
      }
      else {
        pcVar3 = "0 == uv_pipe_open(&pipe_handle, fd[0])";
        uStack_1180 = 0x42;
      }
    }
    else {
      pcVar3 = "0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd)";
      uStack_1180 = 0x41;
    }
  }
  else {
    pcVar3 = "0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0)";
    uStack_1180 = 0x40;
  }
LAB_00141fef:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
          ,uStack_1180,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  int fd[2];
  int n;

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd));
  ASSERT(0 == uv_pipe_open(&pipe_handle, fd[0]));
  ASSERT(0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));

  ctx.fd = fd[1];
  ASSERT(0 == uv_barrier_init(&ctx.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < 10 << 20) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
    ASSERT(n == sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == close(fd[1]));  /* fd[0] is closed by uv_close(). */
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY();
  return 0;
}